

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# History.cpp
# Opt level: O0

void __thiscall
History::History(History *this,int numberOfAssignments,int numberOfWorkingWeekends,
                int numberOfConsecutiveAssignments,int numberOfConsecutiveWorkingDays,
                int numberOfConsecutiveDaysOff,string *lastAssignedShiftType)

{
  int numberOfConsecutiveDaysOff_local;
  int numberOfConsecutiveWorkingDays_local;
  int numberOfConsecutiveAssignments_local;
  int numberOfWorkingWeekends_local;
  int numberOfAssignments_local;
  History *this_local;
  
  this->numberOfAssignments = numberOfAssignments;
  this->numberOfWorkingWeekends = numberOfWorkingWeekends;
  this->numberOfConsecutiveAssignments = numberOfConsecutiveAssignments;
  this->numberOfConsecutiveWorkingDays = numberOfConsecutiveWorkingDays;
  this->numberOfConsecutiveDaysOff = numberOfConsecutiveDaysOff;
  std::__cxx11::string::string
            ((string *)&this->lastAssignedShiftType,(string *)lastAssignedShiftType);
  return;
}

Assistant:

History::History(int numberOfAssignments, int numberOfWorkingWeekends, int numberOfConsecutiveAssignments,
                 int numberOfConsecutiveWorkingDays, int numberOfConsecutiveDaysOff,
                 const string &lastAssignedShiftType) : numberOfAssignments(numberOfAssignments),
                                                        numberOfWorkingWeekends(numberOfWorkingWeekends),
                                                        numberOfConsecutiveAssignments(numberOfConsecutiveAssignments),
                                                        numberOfConsecutiveWorkingDays(numberOfConsecutiveWorkingDays),
                                                        numberOfConsecutiveDaysOff(numberOfConsecutiveDaysOff),
                                                        lastAssignedShiftType(lastAssignedShiftType) {}